

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeCallIndirect
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name table,HeapType type,
          bool isReturn)

{
  Name table_00;
  size_t size;
  CallIndirect *expr;
  bool bVar1;
  Ok local_121;
  IRBuilder *local_120;
  uintptr_t local_118;
  char *local_110;
  uint local_104;
  Err local_100;
  Err *local_d0;
  Err *err;
  Result<wasm::Ok> _val;
  undefined1 local_90 [8];
  CallIndirect curr;
  bool isReturn_local;
  IRBuilder *this_local;
  HeapType type_local;
  Name table_local;
  
  type_local.id = table.super_IString.str._M_len;
  curr._87_1_ = isReturn;
  this_local = (IRBuilder *)type.id;
  CallIndirect::CallIndirect((CallIndirect *)local_90,&this->wasm->allocator);
  curr.super_SpecificExpression<(wasm::Expression::Id)7>.super_Expression.type.id =
       (uintptr_t)this_local;
  join_0x00000010_0x00000000_ = HeapType::getSignature((HeapType *)&this_local);
  size = wasm::Type::size((Type *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&curr.heapType,
             size);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitCallIndirect
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (CallIndirect *)local_90);
  local_d0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_d0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_100,local_d0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_100);
    wasm::Err::~Err(&local_100);
  }
  local_104 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_104 == 0) {
    local_118 = type_local.id;
    local_120 = this_local;
    table_00.super_IString.str._M_str = table.super_IString.str._M_str;
    table_00.super_IString.str._M_len = type_local.id;
    local_110 = table.super_IString.str._M_str;
    expr = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                     (&this->builder,table_00,(Expression *)curr.operands.allocator,
                      (ArenaVector<wasm::Expression_*> *)&curr.heapType,(HeapType)this_local,
                      (bool)(curr._87_1_ & 1));
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_121);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeCallIndirect(Name table, HeapType type, bool isReturn) {
  CallIndirect curr(wasm.allocator);
  curr.heapType = type;
  curr.operands.resize(type.getSignature().params.size());
  CHECK_ERR(visitCallIndirect(&curr));
  push(builder.makeCallIndirect(
    table, curr.target, curr.operands, type, isReturn));
  return Ok{};
}